

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::FullChainBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          FullChainBelief *this,int num_particles)

{
  pointer pvVar1;
  int num_mdp_actions;
  ulong uVar2;
  ulong uVar3;
  ChainState *this_00;
  int iVar4;
  ulong uVar5;
  int num_mdp_states;
  ulong uVar6;
  long lVar7;
  double dVar8;
  ChainState *local_68;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (this->alpha_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->alpha_).
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  uVar3 = ((long)*(pointer *)
                  ((long)&(pvVar1->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          )._M_impl.super__Vector_impl_data + 8) -
          *(long *)&(pvVar1->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data) / 0x18;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar8 = (double)num_particles;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = 0;
  num_mdp_actions = (int)uVar3;
  uVar5 = 0;
  if (0 < num_mdp_actions) {
    uVar5 = uVar3 & 0xffffffff;
  }
  num_mdp_states = (int)uVar2;
  uVar3 = 0;
  if (0 < num_mdp_states) {
    uVar3 = uVar2 & 0xffffffff;
  }
  if (num_particles < 1) {
    num_particles = 0;
  }
  for (; iVar4 != num_particles; iVar4 = iVar4 + 1) {
    this_00 = (ChainState *)
              (**(code **)(**(long **)&this->field_0x8 + 0xa8))
                        (SUB84(1.0 / dVar8,0),*(long **)&this->field_0x8,0xffffffffffffffff);
    ChainState::Init(this_00,num_mdp_states,num_mdp_actions);
    this_00->mdp_state = this->cur_state_;
    for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      lVar7 = 0;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_60,
                   (vector<double,_std::allocator<double>_> *)
                   (*(long *)&(this->alpha_).
                              super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar2].
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data + lVar7));
        despot::Dirichlet::Next(&local_48,&local_60);
        ChainState::SetTransition
                  (this_00,(int)uVar2,(ACT_TYPE)uVar6,
                   (vector<double,_std::allocator<double>_> *)&local_48);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
        lVar7 = lVar7 + 0x18;
      }
    }
    Chain::ComputeOptimalValue(*(Chain **)&this->field_0x8,this_00);
    local_68 = this_00;
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
               (State **)&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> FullChainBelief::Sample(int num_particles) const {
	int num_mdp_states = alpha_.size(), num_mdp_actions = alpha_[0].size();

	vector<State*> samples;
	for (int i = 0; i < num_particles; i++) {
		ChainState* particle = static_cast<ChainState*>(model_->Allocate(-1,
			1.0 / num_particles));
		particle->Init(num_mdp_states, num_mdp_actions);

		particle->mdp_state = cur_state_;
		for (int state = 0; state < num_mdp_states; state++) {
			for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
				particle->SetTransition(state, action,
					Dirichlet::Next(alpha_[state][action]));
			}
		}

		static_cast<const Chain*>(model_)->ComputeOptimalValue(*particle);
		samples.push_back(particle);
	}
	return samples;
}